

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O2

void InitUnigramTable(void)

{
  long lVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double local_28;
  
  table = (int *)malloc(400000000);
  if (table != (int *)0x0) {
    local_28 = 0.0;
    lVar1 = 0;
    for (lVar3 = 0; lVar3 < vocab_size; lVar3 = lVar3 + 1) {
      dVar4 = pow((double)*(long *)((long)&vocab->cn + lVar1),0.75);
      local_28 = local_28 + dVar4;
      lVar1 = lVar1 + 0x28;
    }
    dVar4 = pow((double)vocab->cn,0.75);
    dVar4 = dVar4 / local_28;
    iVar2 = 0;
    for (lVar1 = 0; lVar1 != 100000000; lVar1 = lVar1 + 1) {
      table[lVar1] = iVar2;
      if ((double)(int)lVar1 / 100000000.0 <= dVar4) {
        lVar3 = (long)iVar2;
      }
      else {
        iVar2 = iVar2 + 1;
        lVar3 = (long)iVar2;
        dVar5 = pow((double)vocab[lVar3].cn,0.75);
        dVar4 = dVar4 + dVar5 / local_28;
      }
      if (vocab_size <= lVar3) {
        iVar2 = (int)vocab_size + -1;
      }
    }
    return;
  }
  fwrite("cannot allocate memory for the table\n",0x25,1,_stderr);
  exit(1);
}

Assistant:

void InitUnigramTable() {
  int a, i;
  double train_words_pow = 0;
  double d1, power = 0.75;
  table = (int *)malloc(table_size * sizeof(int));
  if (table == NULL) {
    fprintf(stderr, "cannot allocate memory for the table\n");
    exit(1);
  }
  for (a = 0; a < vocab_size; a++) train_words_pow += pow(vocab[a].cn, power);
  i = 0;
  d1 = pow(vocab[i].cn, power) / train_words_pow;
  for (a = 0; a < table_size; a++) {
    table[a] = i;
    if (a / (double)table_size > d1) {
      i++;
      d1 += pow(vocab[i].cn, power) / train_words_pow;
    }
    if (i >= vocab_size) i = vocab_size - 1;
  }
}